

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O3

void __thiscall
libtorrent::torrent_conflict_alert::~torrent_conflict_alert(torrent_conflict_alert *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  p_Var2 = (this->metadata).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->conflicting_torrent).m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__torrent_alert_004dc350;
  p_Var2 = (this->super_torrent_alert).handle.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  operator_delete(this,0x50);
  return;
}

Assistant:

struct TORRENT_EXPORT torrent_conflict_alert final : torrent_alert
	{
		// internal
		explicit torrent_conflict_alert(aux::stack_allocator& alloc, torrent_handle h1
			, torrent_handle h2, std::shared_ptr<torrent_info> ti);
		TORRENT_DEFINE_ALERT_PRIO(torrent_conflict_alert, 99, alert_priority::high)

		static constexpr alert_category_t static_category = alert_category::error;
		std::string message() const override;

		// the handle to the torrent in conflict. The swarm associated with this
		// torrent handle did not download the metadata, but the downloaded
		// metadata collided with this swarm's info-hash.
		torrent_handle conflicting_torrent;

		// the metadata that was received by one of the torrents in conflict.
		// One way to resolve the conflict is to remove both failing torrents
		// and re-add it using this metadata
		std::shared_ptr<torrent_info> metadata;
	}